

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_Common.cpp
# Opt level: O3

longlong VmLongPow(longlong power,longlong number)

{
  longlong lVar1;
  ulong uVar2;
  long lVar3;
  
  if (-1 < power) {
    lVar1 = 1;
    if (power != 0) {
      do {
        uVar2 = power & 0xfffffffffffffffe;
        lVar3 = 1;
        if ((power & 1U) != 0) {
          lVar3 = number;
        }
        lVar1 = lVar1 * lVar3;
        number = number * number;
        power = (ulong)power >> 1;
      } while (1 < uVar2);
    }
    return lVar1;
  }
  if (number != 1) {
    if (number == -1) {
      return -(ulong)((uint)power & 1) | 1;
    }
    return 0;
  }
  return 1;
}

Assistant:

long long VmLongPow(long long power, long long number)
{
	if(power < 0)
		return number == 1 ? 1 : (number == -1 ? ((power & 1) ? -1 : 1) : 0);

	long long result = 1;
	while(power)
	{
		if(power & 1)
		{
			result *= number;
			power--;
		}
		number *= number;
		power >>= 1;
	}
	return result;
}